

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageOptions::MergePartialFromCodedStream
          (MessageOptions *this,CodedInputStream *input)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  Type *value;
  uint8 *puVar3;
  uint uVar4;
  uint32 tag;
  uint32 temp_1;
  uint32 temp;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_001f7177:
  while( true ) {
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar3 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar4 = tag >> 3;
    uVar2 = tag & 7;
    if (uVar4 != 999) break;
    if (uVar2 != 2) goto LAB_001f726d;
    while( true ) {
      value = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value);
      if (!bVar1) {
        return false;
      }
      puVar3 = input->buffer_;
      if (((*(int *)&input->buffer_end_ - (int)puVar3 < 2) || (*puVar3 != 0xba)) ||
         (puVar3[1] != '>')) break;
LAB_001f72da:
      input->buffer_ = puVar3 + 2;
    }
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  }
  if (uVar4 == 2) {
    if (uVar2 == 0) goto LAB_001f7220;
  }
  else if ((uVar4 == 1) && (uVar2 == 0)) {
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&local_38 + 4));
    if (!bVar1) {
      return false;
    }
    this->message_set_wire_format_ = local_38._4_4_ != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x10')) {
      input->buffer_ = puVar3 + 1;
LAB_001f7220:
      bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_38);
      if (!bVar1) {
        return false;
      }
      this->no_standard_descriptor_accessor_ = (uint32)local_38 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      puVar3 = input->buffer_;
      if (((1 < *(int *)&input->buffer_end_ - (int)puVar3) && (*puVar3 == 0xba)) &&
         (puVar3[1] == '>')) goto LAB_001f72da;
    }
    goto LAB_001f7177;
  }
LAB_001f726d:
  if (uVar2 == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
  }
  else {
    bVar1 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag,input,default_instance_,&this->_unknown_fields_);
  }
  if (bVar1 == false) {
    return false;
  }
  goto LAB_001f7177;
}

Assistant:

bool MessageOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &message_set_wire_format_)));
          set_has_message_set_wire_format();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_no_standard_descriptor_accessor;
        break;
      }

      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_no_standard_descriptor_accessor:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &no_standard_descriptor_accessor_)));
          set_has_no_standard_descriptor_accessor();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}